

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

string * __thiscall
FIX::DoubleConvertor::convert_abi_cxx11_
          (string *__return_storage_ptr__,DoubleConvertor *this,double value,int padding,
          int significant_digits)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uStack_50;
  char result [32];
  
  pcVar5 = result;
  iVar3 = (int)this;
  if ((value < -0.0001) || (((value == 0.0 && (!NAN(value))) || (0.0001 < value)))) {
    uStack_50 = 0x139e85;
    uVar2 = FIX::DoubleConvertor::fast_dtoa(result,0x20,value,padding);
    if (uVar2 == 0) goto LAB_00139eb0;
    uVar4 = (ulong)uVar2;
    if (0 < iVar3) {
      pcVar6 = result + (long)(int)uVar2 + -1;
      iVar3 = iVar3 + (int)result;
      for (; *pcVar5 != '\0'; pcVar5 = pcVar5 + 1) {
        if (*pcVar5 == '.') goto LAB_00139ece;
        iVar3 = iVar3 + 1;
      }
      *pcVar5 = '.';
      uVar4 = (ulong)(uVar2 + 1);
      pcVar6 = pcVar5;
LAB_00139ece:
      uVar2 = iVar3 - (int)pcVar6;
      if (0 < (int)uVar2) {
        uStack_50 = 0x139ee5;
        memset(pcVar6 + 1,0x30,(ulong)uVar2);
        uVar4 = (ulong)(uint)(((int)uVar4 - (int)pcVar6) + iVar3);
      }
    }
  }
  else {
    uStack_50 = 0x139e3c;
    iVar1 = FIX::DoubleConvertor::fast_fixed_dtoa(result,0x20,value,padding);
    if (iVar1 == 0) {
LAB_00139eb0:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    uVar4 = (ulong)iVar1;
    if (iVar3 < 1) {
      for (; result[uVar4 - 1] == '0'; uVar4 = uVar4 - 1) {
      }
    }
    else {
      for (iVar3 = padding - iVar3; (result[uVar4 - 1] == '0' && (0 < iVar3)); iVar3 = iVar3 + -1) {
        uVar4 = uVar4 - 1;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  uStack_50 = 0x139f04;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,result,result + (int)uVar4);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(double value, int padding = 0, int significant_digits = SIGNIFICANT_DIGITS) {
    char result[BUFFFER_SIZE];
    char *end = 0;

    int size;
    if (value == 0 || value > 0.0001 || value < -0.0001) {
      size = fast_dtoa(result, BUFFFER_SIZE, value, significant_digits);
      if (size == 0) {
        return std::string();
      }

      if (padding > 0) {
        char *point = result;
        end = result + size - 1;
        while (*point != '.' && *point != 0) {
          point++;
        }

        if (*point == 0) {
          end = point;
          *point = '.';
          ++size;
        }
        int needed = padding - (int)(end - point);

        if (needed > 0) {
          memset(++end, '0', needed);
          size += needed;
        }
      }
    } else {
      size = fast_fixed_dtoa(result, BUFFFER_SIZE, value, significant_digits);
      if (size == 0) {
        return std::string();
      }

      // strip trailing 0's
      end = result + size - 1;

      if (padding > 0) {
        int discard = significant_digits - padding;

        while ((*end == '0') && (discard-- > 0)) {
          --end;
          --size;
        }
      } else {
        while (*end == '0') {
          --end;
          --size;
        }
      }
    }

    return std::string(result, size);
  }